

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

void __thiscall minihttp::HttpSocket::_ProcessChunk(HttpSocket *this)

{
  char *pcVar1;
  ulong uVar2;
  int __fd;
  char *term;
  uint chunksize;
  HttpSocket *this_local;
  
  if ((this->_chunkedTransfer & 1U) != 0) {
    term._4_4_ = -1;
    while( true ) {
      if (this->_remaining != 0) {
        if ((this->super_TcpSocket)._recvSize < this->_remaining) {
          _OnRecvInternal(this,(this->super_TcpSocket)._readptr,(this->super_TcpSocket)._recvSize);
          this->_remaining = this->_remaining - (this->super_TcpSocket)._recvSize;
          (this->super_TcpSocket)._recvSize = 0;
          return;
        }
        pcVar1 = (this->super_TcpSocket)._readptr;
        _OnRecvInternal(this,pcVar1,this->_remaining - 2);
        __fd = (int)pcVar1;
        (this->super_TcpSocket)._readptr = (this->super_TcpSocket)._readptr + this->_remaining;
        (this->super_TcpSocket)._recvSize = (this->super_TcpSocket)._recvSize - this->_remaining;
        this->_remaining = 0;
        if (term._4_4_ == 0) {
          this->_chunkedTransfer = false;
          _DequeueMore(this);
          if ((this->_mustClose & 1U) == 0) {
            return;
          }
          TcpSocket::close(&this->super_TcpSocket,__fd);
          return;
        }
      }
      pcVar1 = strstr((this->super_TcpSocket)._readptr,"\r\n");
      if (pcVar1 == (char *)0x0) break;
      uVar2 = strtoul((this->super_TcpSocket)._readptr,(char **)0x0,0x10);
      term._4_4_ = (int)uVar2;
      this->_remaining = term._4_4_ + 2;
      (this->super_TcpSocket)._recvSize =
           (this->super_TcpSocket)._recvSize -
           ((int)(pcVar1 + 2) - (int)(this->super_TcpSocket)._readptr);
      (this->super_TcpSocket)._readptr = pcVar1 + 2;
    }
    if ((this->super_TcpSocket)._recvSize != 0) {
      TcpSocket::_ShiftBuffer(&this->super_TcpSocket);
    }
  }
  return;
}

Assistant:

void HttpSocket::_ProcessChunk(void)
{
    if(!_chunkedTransfer)
        return;

    unsigned int chunksize = -1;

    while(true)
    {
        // less data required until chunk end than received, means the new chunk starts somewhere in the middle
        // of the received data block. finish this chunk first.
        if(_remaining)
        {
            if(_remaining <= _recvSize) // it contains the rest of the chunk, including CRLF
            {
                _OnRecvInternal(_readptr, _remaining - 2); // implicitly skip CRLF
                _readptr += _remaining;
                _recvSize -= _remaining;
                _remaining = 0; // done with this one.
                if(!chunksize) // and if chunksize was 0, we are done with all chunks.
                    break;
            }
            else // buffer did not yet arrive completely
            {
                _OnRecvInternal(_readptr, _recvSize);
                _remaining -= _recvSize;
                _recvSize = 0; // done with the whole buffer, but not with the chunk
                return; // nothing else to do here
            }
        }

        // each chunk identifier ends with CRLF.
        // if we don't find that, we hit the corner case that the chunk identifier was not fully received.
        // in that case, adjust the buffer and wait for the rest of the data to be appended
        char *term = strstr(_readptr, "\r\n");
        if(!term)
        {
            if(_recvSize) // if there is still something queued, move it to the left of the buffer and append on next read
                _ShiftBuffer();
            return;
        }
        term += 2; // skip CRLF

        // when we are here, the (next) chunk header was completely received.
        chunksize = strtoul(_readptr, NULL, 16);
        _remaining = chunksize + 2; // the http protocol specifies that each chunk has a trailing CRLF
        _recvSize -= (term - _readptr);
        _readptr = term;
    }

    if(!chunksize) // this was the last chunk, no further data expected unless requested
    {
        _chunkedTransfer = false;
        _DequeueMore();
        if(_recvSize)
            traceprint("_ProcessChunk: There are %u bytes left in the buffer, huh?\n", _recvSize);
        if(_mustClose)
            close();
    }
}